

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIsoFast.c
# Opt level: O2

void Iso_StoStop(Iso_Sto_t *p)

{
  Vec_IntFree(p->vPlaces);
  Vec_IntFree(p->vVisited);
  Vec_PtrFree(p->vRoots);
  if (p->pCounters != (int *)0x0) {
    free(p->pCounters);
    p->pCounters = (int *)0x0;
  }
  free(p->pData);
  free(p);
  return;
}

Assistant:

void Iso_StoStop( Iso_Sto_t * p )
{
    Vec_IntFree( p->vPlaces );
    Vec_IntFree( p->vVisited );
    Vec_PtrFree( p->vRoots );
    ABC_FREE( p->pCounters );
    ABC_FREE( p->pData );
    ABC_FREE( p );
}